

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

unsigned_short __thiscall Am_Object::Get_Type_Check(Am_Object *this,Am_Slot_Key key)

{
  unsigned_short uVar1;
  Am_Slot local_28;
  Am_Slot_Data *local_20;
  Am_Slot_Data *slot;
  Am_Object *pAStack_10;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  slot._6_2_ = key;
  pAStack_10 = this;
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("Get_Type_Check called on a (0L) object.");
  }
  local_20 = Am_Object_Data::find_slot(this->data,key);
  if (local_20 == (Am_Slot_Data *)0x0) {
    slot_error("Get_Type_Check: slot does not exist",this,slot._6_2_);
  }
  Am_Slot::Am_Slot(&local_28,local_20);
  uVar1 = Am_Slot::Get_Type_Check(&local_28);
  return uVar1;
}

Assistant:

unsigned short
Am_Object::Get_Type_Check(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("Get_Type_Check called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (!slot)
    slot_error("Get_Type_Check: slot does not exist", *this, key);
  return Am_Slot(slot).Get_Type_Check();
}